

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void dumpFunction(DumpState *D,Proto *f)

{
  TValue *pTVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint align;
  TString *ts;
  ulong uVar3;
  ulong uVar4;
  undefined8 local_38;
  
  local_38 = in_RAX;
  dumpInt(D,f->linedefined);
  dumpInt(D,f->lastlinedefined);
  dumpByte(D,(uint)f->numparams);
  dumpByte(D,(uint)f->flag);
  dumpByte(D,(uint)f->maxstacksize);
  uVar2 = f->sizecode;
  dumpInt(D,uVar2);
  dumpAlign(D,uVar2);
  dumpBlock(D,f->code,(ulong)(uint)f->sizecode << 2);
  uVar2 = f->sizek;
  dumpInt(D,uVar2);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar4 * 0x10 == uVar3) {
      uVar2 = f->sizeupvalues;
      dumpInt(D,uVar2);
      uVar3 = 0;
      uVar4 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar4 = uVar3;
      }
      for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
        dumpByte(D,(uint)(&f->upvalues->instack)[uVar3]);
        dumpByte(D,(uint)(&f->upvalues->idx)[uVar3]);
        dumpByte(D,(uint)(&f->upvalues->kind)[uVar3]);
      }
      uVar2 = f->sizep;
      dumpInt(D,uVar2);
      uVar3 = 0;
      uVar4 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar4 = uVar3;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        dumpFunction(D,f->p[uVar3]);
      }
      uVar2 = 0;
      if (D->strip == 0) {
        ts = f->source;
      }
      else {
        ts = (TString *)0x0;
      }
      dumpString(D,ts);
      if (D->strip == 0) {
        uVar2 = f->sizelineinfo;
      }
      dumpInt(D,uVar2);
      if (f->lineinfo != (ls_byte *)0x0) {
        dumpBlock(D,f->lineinfo,(ulong)uVar2);
      }
      uVar2 = 0;
      if (D->strip == 0) {
        uVar2 = f->sizeabslineinfo;
      }
      align = uVar2;
      dumpInt(D,uVar2);
      if (0 < (int)uVar2) {
        dumpAlign(D,align);
        dumpBlock(D,f->abslineinfo,(ulong)uVar2 << 3);
      }
      uVar4 = 0;
      uVar2 = 0;
      if (D->strip == 0) {
        uVar2 = f->sizelocvars;
      }
      dumpInt(D,uVar2);
      uVar3 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
        dumpString(D,*(TString **)((long)&f->locvars->varname + uVar4));
        dumpInt(D,*(int *)((long)&f->locvars->startpc + uVar4));
        dumpInt(D,*(int *)((long)&f->locvars->endpc + uVar4));
      }
      uVar4 = 0;
      uVar2 = 0;
      if (D->strip == 0) {
        uVar2 = f->sizeupvalues;
      }
      dumpInt(D,uVar2);
      uVar3 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
        dumpString(D,*(TString **)((long)&f->upvalues->name + uVar4));
      }
      return;
    }
    pTVar1 = f->k;
    uVar2 = (&pTVar1->tt_)[uVar3] & 0x3f;
    dumpByte(D,uVar2);
    if (uVar2 == 3) {
      local_38 = *(undefined8 *)((long)&pTVar1->value_ + uVar3);
LAB_0010bc5b:
      dumpBlock(D,&local_38,8);
    }
    else if ((uVar2 == 4) || (uVar2 == 0x14)) {
      dumpString(D,*(TString **)((long)&pTVar1->value_ + uVar3));
    }
    else if (uVar2 == 0x13) {
      local_38 = *(undefined8 *)((long)&pTVar1->value_ + uVar3);
      goto LAB_0010bc5b;
    }
    uVar3 = uVar3 + 0x10;
  } while( true );
}

Assistant:

static void dumpFunction (DumpState *D, const Proto *f) {
  dumpInt(D, f->linedefined);
  dumpInt(D, f->lastlinedefined);
  dumpByte(D, f->numparams);
  dumpByte(D, f->flag);
  dumpByte(D, f->maxstacksize);
  dumpCode(D, f);
  dumpConstants(D, f);
  dumpUpvalues(D, f);
  dumpProtos(D, f);
  dumpString(D, D->strip ? NULL : f->source);
  dumpDebug(D, f);
}